

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O1

void __thiscall
amrex::DeriveRec::DeriveRec
          (DeriveRec *this,string *a_name,IndexType result_type,int nvar_derive,
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *var_names,DeriveFuncFab *der_func_fab,DeriveBoxMap box_map,Interpolater *a_interp)

{
  pointer pcVar1;
  
  (this->derive_name)._M_dataplus._M_p = (pointer)&(this->derive_name).field_2;
  pcVar1 = (a_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + a_name->_M_string_length)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->variable_names).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,&var_names->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  (this->der_type).itype = result_type.itype;
  this->n_derive = nvar_derive;
  this->func = (DeriveFunc)0x0;
  this->func_3d = (DeriveFunc3D)0x0;
  std::
  function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
  ::function(&this->func_fab,der_func_fab);
  this->mapper = a_interp;
  this->bx_map = box_map;
  this->n_state = 0;
  this->nsr = 0;
  this->rng = (StateRange *)0x0;
  this->bcr = (int *)0x0;
  this->bcr3D = (int *)0x0;
  return;
}

Assistant:

DeriveRec::DeriveRec (const std::string& a_name,
                      IndexType      result_type,
                      int            nvar_derive,
                      Vector<std::string> const& var_names,
                      DeriveFuncFab  der_func_fab,
                      DeriveBoxMap   box_map,
                      Interpolater*  a_interp)
    :
    derive_name(a_name),
    variable_names(var_names),
    der_type(result_type),
    n_derive(nvar_derive),
    func_fab(der_func_fab),
    mapper(a_interp),
    bx_map(box_map)
{}